

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void compress_block(deflate_state *s,ct_data *ltree,ct_data *dtree)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint local_68;
  int val_5;
  int len_5;
  int val_4;
  int len_4;
  int val_3;
  int len_3;
  int val_2;
  int len_2;
  int val_1;
  int len_1;
  int val;
  int len;
  int extra;
  uint code;
  uint lx;
  int lc;
  uint dist;
  ct_data *dtree_local;
  ct_data *ltree_local;
  deflate_state *s_local;
  
  extra = 0;
  if (s->last_lit != 0) {
    do {
      uVar2 = s->d_buf[(uint)extra];
      uVar9 = extra + 1;
      uVar8 = (uint)s->l_buf[(uint)extra];
      if (uVar2 == 0) {
        uVar6 = (uint)ltree[(int)uVar8].dl.dad;
        if ((int)(0x10 - uVar6) < s->bi_valid) {
          uVar2 = ltree[(int)uVar8].fc.freq;
          s->bi_buf = s->bi_buf | uVar2 << ((byte)s->bi_valid & 0x1f);
          uVar8 = s->pending;
          s->pending = uVar8 + 1;
          s->pending_buf[uVar8] = (z_Bytef)s->bi_buf;
          uVar8 = s->pending;
          s->pending = uVar8 + 1;
          s->pending_buf[uVar8] = (z_Bytef)(s->bi_buf >> 8);
          s->bi_buf = (ush)((int)(uint)uVar2 >> (0x10U - (char)s->bi_valid & 0x1f));
          s->bi_valid = s->bi_valid + (uVar6 - 0x10);
        }
        else {
          s->bi_buf = s->bi_buf | ltree[(int)uVar8].fc.freq << ((byte)s->bi_valid & 0x1f);
          s->bi_valid = uVar6 + s->bi_valid;
        }
      }
      else {
        uVar6 = (uint)""[(int)uVar8];
        uVar7 = (uint)ltree[uVar6 + 0x101].dl.dad;
        if ((int)(0x10 - uVar7) < s->bi_valid) {
          uVar3 = ltree[uVar6 + 0x101].fc.freq;
          s->bi_buf = s->bi_buf | uVar3 << ((byte)s->bi_valid & 0x1f);
          uVar4 = s->pending;
          s->pending = uVar4 + 1;
          s->pending_buf[uVar4] = (z_Bytef)s->bi_buf;
          uVar4 = s->pending;
          s->pending = uVar4 + 1;
          s->pending_buf[uVar4] = (z_Bytef)(s->bi_buf >> 8);
          s->bi_buf = (ush)((int)(uint)uVar3 >> (0x10U - (char)s->bi_valid & 0x1f));
          s->bi_valid = s->bi_valid + (uVar7 - 0x10);
        }
        else {
          s->bi_buf = s->bi_buf | ltree[uVar6 + 0x101].fc.freq << ((byte)s->bi_valid & 0x1f);
          s->bi_valid = uVar7 + s->bi_valid;
        }
        iVar5 = extra_lbits[uVar6];
        if (iVar5 != 0) {
          uVar8 = uVar8 - base_length[uVar6];
          if (0x10 - iVar5 < s->bi_valid) {
            s->bi_buf = s->bi_buf | (ushort)(uVar8 << ((byte)s->bi_valid & 0x1f));
            uVar6 = s->pending;
            s->pending = uVar6 + 1;
            s->pending_buf[uVar6] = (z_Bytef)s->bi_buf;
            uVar6 = s->pending;
            s->pending = uVar6 + 1;
            s->pending_buf[uVar6] = (z_Bytef)(s->bi_buf >> 8);
            s->bi_buf = (ush)((int)(uVar8 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            s->bi_valid = s->bi_valid + iVar5 + -0x10;
          }
          else {
            s->bi_buf = s->bi_buf | (ushort)(uVar8 << ((byte)s->bi_valid & 0x1f));
            s->bi_valid = iVar5 + s->bi_valid;
          }
        }
        uVar8 = uVar2 - 1;
        if (uVar8 < 0x100) {
          bVar1 = ""[uVar8];
        }
        else {
          bVar1 = ""[(uVar8 >> 7) + 0x100];
        }
        local_68 = (uint)bVar1;
        uVar6 = (uint)dtree[local_68].dl.dad;
        if ((int)(0x10 - uVar6) < s->bi_valid) {
          uVar2 = dtree[local_68].fc.freq;
          s->bi_buf = s->bi_buf | uVar2 << ((byte)s->bi_valid & 0x1f);
          uVar7 = s->pending;
          s->pending = uVar7 + 1;
          s->pending_buf[uVar7] = (z_Bytef)s->bi_buf;
          uVar7 = s->pending;
          s->pending = uVar7 + 1;
          s->pending_buf[uVar7] = (z_Bytef)(s->bi_buf >> 8);
          s->bi_buf = (ush)((int)(uint)uVar2 >> (0x10U - (char)s->bi_valid & 0x1f));
          s->bi_valid = s->bi_valid + (uVar6 - 0x10);
        }
        else {
          s->bi_buf = s->bi_buf | dtree[local_68].fc.freq << ((byte)s->bi_valid & 0x1f);
          s->bi_valid = uVar6 + s->bi_valid;
        }
        iVar5 = extra_dbits[local_68];
        if (iVar5 != 0) {
          uVar8 = uVar8 - base_dist[local_68];
          if (0x10 - iVar5 < s->bi_valid) {
            s->bi_buf = s->bi_buf | (ushort)(uVar8 << ((byte)s->bi_valid & 0x1f));
            uVar6 = s->pending;
            s->pending = uVar6 + 1;
            s->pending_buf[uVar6] = (z_Bytef)s->bi_buf;
            uVar6 = s->pending;
            s->pending = uVar6 + 1;
            s->pending_buf[uVar6] = (z_Bytef)(s->bi_buf >> 8);
            s->bi_buf = (ush)((int)(uVar8 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            s->bi_valid = s->bi_valid + iVar5 + -0x10;
          }
          else {
            s->bi_buf = s->bi_buf | (ushort)(uVar8 << ((byte)s->bi_valid & 0x1f));
            s->bi_valid = iVar5 + s->bi_valid;
          }
        }
      }
      extra = uVar9;
    } while (uVar9 < s->last_lit);
  }
  uVar8 = (uint)ltree[0x100].dl.dad;
  if ((int)(0x10 - uVar8) < s->bi_valid) {
    uVar2 = ltree[0x100].fc.freq;
    s->bi_buf = s->bi_buf | uVar2 << ((byte)s->bi_valid & 0x1f);
    uVar9 = s->pending;
    s->pending = uVar9 + 1;
    s->pending_buf[uVar9] = (z_Bytef)s->bi_buf;
    uVar9 = s->pending;
    s->pending = uVar9 + 1;
    s->pending_buf[uVar9] = (z_Bytef)(s->bi_buf >> 8);
    s->bi_buf = (ush)((int)(uint)uVar2 >> (0x10U - (char)s->bi_valid & 0x1f));
    s->bi_valid = s->bi_valid + (uVar8 - 0x10);
  }
  else {
    s->bi_buf = s->bi_buf | ltree[0x100].fc.freq << ((byte)s->bi_valid & 0x1f);
    s->bi_valid = uVar8 + s->bi_valid;
  }
  s->last_eob_len = (uint)ltree[0x100].dl.dad;
  return;
}

Assistant:

local void compress_block(s, ltree, dtree)
    deflate_state *s;
    ct_data *ltree; /* literal tree */
    ct_data *dtree; /* distance tree */
{
    unsigned dist;      /* distance of matched string */
    int lc;             /* match length or unmatched char (if dist == 0) */
    unsigned lx = 0;    /* running index in l_buf */
    unsigned code;      /* the code to send */
    int extra;          /* number of extra bits to send */

    if (s->last_lit != 0) do {
        dist = s->d_buf[lx];
        lc = s->l_buf[lx++];
        if (dist == 0) {
            send_code(s, lc, ltree); /* send a literal byte */
            Tracecv(isgraph(lc), (stderr," '%c' ", lc));
        } else {
            /* Here, lc is the match length - MIN_MATCH */
            code = _length_code[lc];
            send_code(s, code+LITERALS+1, ltree); /* send the length code */
            extra = extra_lbits[code];
            if (extra != 0) {
                lc -= base_length[code];
                send_bits(s, lc, extra);       /* send the extra length bits */
            }
            dist--; /* dist is now the match distance - 1 */
            code = d_code(dist);
            Assert (code < D_CODES, "bad d_code");

            send_code(s, code, dtree);       /* send the distance code */
            extra = extra_dbits[code];
            if (extra != 0) {
                dist -= base_dist[code];
                send_bits(s, dist, extra);   /* send the extra distance bits */
            }
        } /* literal or match pair ? */

        /* Check that the overlay between pending_buf and d_buf+l_buf is ok: */
        Assert((uInt)(s->pending) < s->lit_bufsize + 2*lx,
               "pendingBuf overflow");

    } while (lx < s->last_lit);

    send_code(s, END_BLOCK, ltree);
    s->last_eob_len = ltree[END_BLOCK].Len;
}